

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb
          (cbtQuantizedBvh *this,cbtQuantizedBvhNode *currentNode,
          cbtNodeOverlapCallback *nodeCallback,unsigned_short *quantizedQueryAabbMin,
          unsigned_short *quantizedQueryAabbMax)

{
  cbtQuantizedBvhNode *pcVar1;
  uint uVar2;
  cbtQuantizedBvhNode *pcVar3;
  
  while ((((*quantizedQueryAabbMin <= currentNode->m_quantizedAabbMax[0] &&
           (currentNode->m_quantizedAabbMin[0] <= *quantizedQueryAabbMax)) &&
          (quantizedQueryAabbMin[2] <= currentNode->m_quantizedAabbMax[2])) &&
         (((currentNode->m_quantizedAabbMin[2] <= quantizedQueryAabbMax[2] &&
           (quantizedQueryAabbMin[1] <= currentNode->m_quantizedAabbMax[1])) &&
          (currentNode->m_quantizedAabbMin[1] <= quantizedQueryAabbMax[1]))))) {
    uVar2 = currentNode->m_escapeIndexOrTriangleIndex;
    if (-1 < (int)uVar2) {
      (*nodeCallback->_vptr_cbtNodeOverlapCallback[2])
                (nodeCallback,(ulong)(uVar2 >> 0x15),(ulong)(uVar2 & 0x1fffff));
      return;
    }
    walkRecursiveQuantizedTreeAgainstQueryAabb
              (this,currentNode + 1,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
    pcVar3 = currentNode + 1;
    pcVar1 = currentNode + (ulong)(uint)-pcVar3->m_escapeIndexOrTriangleIndex + 1;
    currentNode = currentNode + 2;
    if (pcVar3->m_escapeIndexOrTriangleIndex < 0) {
      currentNode = pcVar1;
    }
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb(const cbtQuantizedBvhNode* currentNode, cbtNodeOverlapCallback* nodeCallback, unsigned short int* quantizedQueryAabbMin, unsigned short int* quantizedQueryAabbMax) const
{
	cbtAssert(m_useQuantization);

	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	//PCK: unsigned instead of bool
	aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin, quantizedQueryAabbMax, currentNode->m_quantizedAabbMin, currentNode->m_quantizedAabbMax);
	isLeafNode = currentNode->isLeafNode();

	//PCK: unsigned instead of bool
	if (aabbOverlap != 0)
	{
		if (isLeafNode)
		{
			nodeCallback->processNode(currentNode->getPartId(), currentNode->getTriangleIndex());
		}
		else
		{
			//process left and right children
			const cbtQuantizedBvhNode* leftChildNode = currentNode + 1;
			walkRecursiveQuantizedTreeAgainstQueryAabb(leftChildNode, nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);

			const cbtQuantizedBvhNode* rightChildNode = leftChildNode->isLeafNode() ? leftChildNode + 1 : leftChildNode + leftChildNode->getEscapeIndex();
			walkRecursiveQuantizedTreeAgainstQueryAabb(rightChildNode, nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);
		}
	}
}